

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall AddrManImpl::ClearNew(AddrManImpl *this,int nUBucket,int nUBucketPos)

{
  int iVar1;
  long lVar2;
  string_view source_file;
  bool bVar3;
  mapped_type *this_00;
  Logger *pLVar4;
  key_type *__k;
  int *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nIdDelete;
  int nUBucketPos_local;
  int nUBucket_local;
  string local_e8 [4];
  string local_68;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->vvNew[nUBucket][nUBucketPos];
  nUBucketPos_local = nUBucketPos;
  nUBucket_local = nUBucket;
  if (iVar1 != -1) {
    __k = &nIdDelete;
    nIdDelete = iVar1;
    this_00 = std::__detail::
              _Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->mapInfo,__k);
    if (this_00->nRefCount < 1) {
      __assert_fail("infoDelete.nRefCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                    ,0x1e1,"void AddrManImpl::ClearNew(int, int)");
    }
    this_00->nRefCount = this_00->nRefCount + -1;
    this->vvNew[nUBucket][nUBucketPos] = -1;
    bVar3 = ::LogAcceptCategory(ADDRMAN,(Level)__k);
    if (bVar3) {
      CService::ToStringAddrPort_abi_cxx11_(local_e8,(CService *)this_00);
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar4);
      if (bVar3) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,int,int>
                  (&local_68,(tinyformat *)"Removed %s from new[%i][%i]\n",(char *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nUBucket_local,&nUBucketPos_local,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        pLVar4 = LogInstance();
        local_68._M_dataplus._M_p = (pointer)0x54;
        local_68._M_string_length = 0xca13c8;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
        source_file._M_len = 0x54;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "ClearNew";
        logging_function._M_len = 8;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x1e4,ADDRMAN,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)local_e8);
    }
    if (this_00->nRefCount == 0) {
      Delete(this,nIdDelete);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::ClearNew(int nUBucket, int nUBucketPos)
{
    AssertLockHeld(cs);

    // if there is an entry in the specified bucket, delete it.
    if (vvNew[nUBucket][nUBucketPos] != -1) {
        int nIdDelete = vvNew[nUBucket][nUBucketPos];
        AddrInfo& infoDelete = mapInfo[nIdDelete];
        assert(infoDelete.nRefCount > 0);
        infoDelete.nRefCount--;
        vvNew[nUBucket][nUBucketPos] = -1;
        LogDebug(BCLog::ADDRMAN, "Removed %s from new[%i][%i]\n", infoDelete.ToStringAddrPort(), nUBucket, nUBucketPos);
        if (infoDelete.nRefCount == 0) {
            Delete(nIdDelete);
        }
    }
}